

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O3

void predict_or_learn<false,false,true,false>(oaa *o,single_learner *base,example *ec)

{
  float fVar1;
  uint uVar2;
  uint64_t uVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  ostream *poVar12;
  uint64_t uVar13;
  ulong uVar14;
  ulong uVar15;
  features *this;
  uint64_t uVar16;
  polyprediction *ppVar17;
  uint uVar18;
  v_array<float> scores_array;
  stringstream outputStringStream;
  v_array<float> local_1d8;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  uVar2 = (ec->l).multi.label;
  fVar1 = (ec->l).simple.weight;
  if (((ulong)uVar2 == 0) || ((uVar2 != 0xffffffff && (o->k < (ulong)uVar2)))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"label ",6);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," is not in {1,",0xe);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"} This won\'t work right.",0x18);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1d8._begin = (ec->pred).scalars._begin;
  local_1d8._end = (ec->pred).scalars._end;
  local_1d8.end_array._0_4_ = *(undefined4 *)((long)&ec->pred + 0x10);
  local_1d8.end_array._4_4_ = *(undefined4 *)((long)&ec->pred + 0x14);
  local_1d8.erase_count._0_4_ = *(undefined4 *)((long)&ec->pred + 0x18);
  local_1d8.erase_count._4_4_ = *(undefined4 *)((long)&ec->pred + 0x1c);
  (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
  (ec->l).simple.initial = 0.0;
  uVar3 = o->k;
  ppVar17 = o->pred;
  if (*(code **)(base + 0x40) == (code *)0x0) {
    uVar16 = uVar3;
    if (uVar3 == 0) {
      uVar13 = (ec->super_example_predict).ft_offset;
    }
    else {
      do {
        (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        fVar5 = (ec->pred).scalar;
        fVar6 = *(float *)((long)&ec->pred + 4);
        uVar7 = *(undefined4 *)((long)&ec->pred + 8);
        uVar8 = *(undefined4 *)((long)&ec->pred + 0xc);
        uVar9 = *(undefined4 *)((long)&ec->pred + 0x14);
        uVar10 = *(undefined4 *)((long)&ec->pred + 0x18);
        uVar11 = *(undefined4 *)((long)&ec->pred + 0x1c);
        *(undefined4 *)&(ppVar17->scalars).end_array = *(undefined4 *)((long)&ec->pred + 0x10);
        *(undefined4 *)((long)&(ppVar17->scalars).end_array + 4) = uVar9;
        *(undefined4 *)&(ppVar17->scalars).erase_count = uVar10;
        *(undefined4 *)((long)&(ppVar17->scalars).erase_count + 4) = uVar11;
        ppVar17->scalar = fVar5;
        *(float *)((long)&(ppVar17->scalars)._begin + 4) = fVar6;
        *(undefined4 *)&(ppVar17->scalars)._end = uVar7;
        *(undefined4 *)((long)&(ppVar17->scalars)._end + 4) = uVar8;
        uVar13 = (ulong)*(uint *)(base + 0xe0) + (ec->super_example_predict).ft_offset;
        (ec->super_example_predict).ft_offset = uVar13;
        ppVar17 = ppVar17 + 1;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
    }
    uVar13 = uVar13 - (uint)((int)uVar3 * *(int *)(base + 0xe0));
  }
  else {
    (**(code **)(base + 0x40))
              (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec,uVar3,
               *(undefined8 *)(base + 0xe0),ppVar17,1);
    uVar13 = (ec->super_example_predict).ft_offset;
  }
  (ec->super_example_predict).ft_offset = uVar13;
  uVar14 = o->k;
  this = ec->passthrough;
  if (uVar14 != 0 && this != (features *)0x0) {
    uVar15 = 1;
    uVar18 = 2;
    while( true ) {
      if (this != (features *)0x0) {
        features::push_back(this,o->pred[uVar18 - 2].scalar,uVar15 ^ 0x398d9fda640553);
        uVar14 = o->k;
      }
      uVar15 = (ulong)uVar18;
      if (uVar14 < uVar15) break;
      this = ec->passthrough;
      uVar18 = uVar18 + 1;
    }
  }
  v_array<float>::clear(&local_1d8);
  if (o->k != 0) {
    uVar14 = 0;
    uVar15 = 1;
    do {
      v_array<float>::push_back(&local_1d8,&o->pred[uVar14].scalar);
      bVar4 = uVar15 < o->k;
      uVar14 = uVar15;
      uVar15 = (ulong)((int)uVar15 + 1);
    } while (bVar4);
  }
  (ec->pred).scalars.end_array =
       (float *)CONCAT44(local_1d8.end_array._4_4_,local_1d8.end_array._0_4_);
  (ec->pred).scalars.erase_count =
       CONCAT44(local_1d8.erase_count._4_4_,(undefined4)local_1d8.erase_count);
  (ec->pred).scalars._begin = local_1d8._begin;
  (ec->pred).scalars._end = local_1d8._end;
  (ec->l).multi.label = uVar2;
  (ec->l).simple.weight = fVar1;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void predict_or_learn(oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTICLASS::label_t mc_label_data = ec.l.multi;
  if (mc_label_data.label == 0 || (mc_label_data.label > o.k && mc_label_data.label != (uint32_t)-1))
    cout << "label " << mc_label_data.label << " is not in {1," << o.k << "} This won't work right." << endl;

  stringstream outputStringStream;
  uint32_t prediction = 1;
  v_array<float> scores_array;
  if (scores)
    scores_array = ec.pred.scalars;

  ec.l.simple = {FLT_MAX, 0.f, 0.f};
  base.multipredict(ec, 0, o.k, o.pred, true);
  for (uint32_t i = 2; i <= o.k; i++)
    if (o.pred[i - 1].scalar > o.pred[prediction - 1].scalar)
      prediction = i;

  if (ec.passthrough)
    for (uint32_t i = 1; i <= o.k; i++) add_passthrough_feature(ec, i, o.pred[i - 1].scalar);

  if (is_learn)
  {
    for (uint32_t i = 1; i <= o.k; i++)
    {
      ec.l.simple = {(mc_label_data.label == i) ? 1.f : -1.f, 0.f, 0.f};
      ec.pred.scalar = o.pred[i - 1].scalar;
      base.update(ec, i - 1);
    }
  }

  if (print_all)
  {
    outputStringStream << "1:" << o.pred[0].scalar;
    for (uint32_t i = 2; i <= o.k; i++) outputStringStream << ' ' << i << ':' << o.pred[i - 1].scalar;
    o.all->print_text(o.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (scores)
  {
    scores_array.clear();
    for (uint32_t i = 0; i < o.k; i++) scores_array.push_back(o.pred[i].scalar);
    ec.pred.scalars = scores_array;

    if (probabilities)
    {
      float sum_prob = 0;
      for (uint32_t i = 0; i < o.k; i++)
      {
        ec.pred.scalars[i] = 1.f / (1.f + correctedExp(-o.pred[i].scalar));
        sum_prob += ec.pred.scalars[i];
      }
      float inv_sum_prob = 1.f / sum_prob;
      for (uint32_t i = 0; i < o.k; i++) ec.pred.scalars[i] *= inv_sum_prob;
    }
  }
  else
    ec.pred.multiclass = prediction;

  ec.l.multi = mc_label_data;
}